

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVectorEnumerator.cpp
# Opt level: O2

void __thiscall JsUtil::FBVEnumerator::MoveToNextBit(FBVEnumerator *this)

{
  long lVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type TVar5;
  uint index;
  
  TVar5 = (this->curUnit).word;
  if (TVar5 == 0) {
    *(byte *)&this->curOffset = (byte)this->curOffset & 0xc0;
    MoveToValidWord(this);
    if (this->icur == this->iend) {
      return;
    }
    TVar5 = (this->curUnit).word;
  }
  if (TVar5 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVectorEnumerator.cpp"
                       ,0x34,"(BVInvalidIndex != i)",
                       "Fatal Exception. Error in Bitvector implementation");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  lVar1 = 0;
  if (TVar5 != 0) {
    for (; (TVar5 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
    }
  }
  index = -(uint)(TVar5 == 0) | (uint)lVar1;
  this->curOffset = (this->curOffset & 0xffffffc0) + index;
  BVUnitT<unsigned_long>::Clear(&this->curUnit,index);
  return;
}

Assistant:

void
    FBVEnumerator::MoveToNextBit()
    {
        if(curUnit.IsEmpty())
        {
            this->curOffset = BVUnit::Floor(curOffset);
            this->MoveToValidWord();
            if(this->End())
            {
                return;
            }
        }

        BVIndex i = curUnit.GetNextBit();
        AssertMsg(BVInvalidIndex != i, "Fatal Exception. Error in Bitvector implementation");

        curOffset = BVUnit::Floor(curOffset) + i ;
        curUnit.Clear(i);
    }